

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

void __thiscall
icu_63::LaoBreakEngine::LaoBreakEngine
          (LaoBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeSet *this_02;
  UnicodeSet *this_03;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__LaoBreakEngine_003a8c08;
  this_00 = &this->fLaoWordSet;
  UnicodeSet::UnicodeSet(this_00);
  this_01 = &this->fEndWordSet;
  UnicodeSet::UnicodeSet(this_01);
  this_02 = &this->fBeginWordSet;
  UnicodeSet::UnicodeSet(this_02);
  this_03 = &this->fMarkSet;
  UnicodeSet::UnicodeSet(this_03);
  this->fDictionary = adoptDictionary;
  local_98.p_ = L"[[:Laoo:]&[:LineBreak=SA:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
  UnicodeSet::applyPattern(this_00,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_80 = local_98.p_;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,this_00);
  }
  local_a0.p_ = L"[[:Laoo:]&[:LineBreak=SA:]&[:M:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_a0,-1);
  UnicodeSet::applyPattern(this_03,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_90 = local_a0.p_;
  UnicodeSet::add(this_03,0x20);
  UnicodeSet::operator=(this_01,this_00);
  UnicodeSet::remove(this_01,(char *)0xec0);
  UnicodeSet::add(this_02,0xe81,0xeae);
  UnicodeSet::add(this_02,0xedc,0xedd);
  UnicodeSet::add(this_02,0xec0,0xec4);
  UnicodeSet::compact(this_03);
  UnicodeSet::compact(this_01);
  UnicodeSet::compact(this_02);
  return;
}

Assistant:

LaoBreakEngine::LaoBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fLaoWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Laoo:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fLaoWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Laoo:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fLaoWordSet;
    fEndWordSet.remove(0x0EC0, 0x0EC4);     // prefix vowels
    fBeginWordSet.add(0x0E81, 0x0EAE);      // basic consonants (including holes for corresponding Thai characters)
    fBeginWordSet.add(0x0EDC, 0x0EDD);      // digraph consonants (no Thai equivalent)
    fBeginWordSet.add(0x0EC0, 0x0EC4);      // prefix vowels

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
}